

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase211::run(TestCase211 *this)

{
  bool bVar1;
  uint local_164;
  Fault f;
  Builder root;
  Orphan<capnp::Text> orphan;
  unsigned_long local_100;
  MallocMessageBuilder builder;
  
  MallocMessageBuilder::MallocMessageBuilder(&builder,0x400,GROW_HEURISTICALLY);
  root._builder._0_16_ = MessageBuilder::getOrphanage(&builder.super_MessageBuilder);
  Orphanage::newOrphan<capnp::Text>(&orphan,(Orphanage *)&root,8);
  OrphanBuilder::asText((Builder *)&root,&orphan.builder);
  if (root._builder.data == (void *)0x9) {
    OrphanBuilder::asText((Builder *)&root,&orphan.builder);
    ((root._builder.capTable)->super_CapTableReader)._vptr_CapTableReader =
         (_func_int **)0x3837363534333231;
    MessageBuilder::initRoot<capnproto_test::capnp::test::TestAllTypes>
              (&root,&builder.super_MessageBuilder);
    capnproto_test::capnp::test::TestAllTypes::Builder::adoptTextField(&root,&orphan);
    capnproto_test::capnp::test::TestAllTypes::Builder::getTextField((Builder *)&f,&root);
    bVar1 = operator==("12345678",(Builder *)&f);
    if (!bVar1 && kj::_::Debug::minSeverity < 3) {
      capnproto_test::capnp::test::TestAllTypes::Builder::getTextField((Builder *)&f,&root);
      kj::_::Debug::log<char_const(&)[55],char_const(&)[9],capnp::Text::Builder>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0xdc,ERROR,
                 "\"failed: expected \" \"(\\\"12345678\\\") == (root.getTextField())\", \"12345678\", root.getTextField()"
                 ,(char (*) [55])"failed: expected (\"12345678\") == (root.getTextField())",
                 (char (*) [9])"12345678",(Builder *)&f);
    }
    OrphanBuilder::~OrphanBuilder(&orphan.builder);
    MallocMessageBuilder::~MallocMessageBuilder(&builder);
    return;
  }
  local_164 = 8;
  OrphanBuilder::asText((Builder *)&root,&orphan.builder);
  local_100 = (long)root._builder.data - 1;
  kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_long>
            (&f,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
             ,0xd7,FAILED,"(8u) == (orphan.get().size())","8u, orphan.get().size()",&local_164,
             &local_100);
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

TEST(Orphans, OrphanageText) {
  MallocMessageBuilder builder;

  Orphan<Text> orphan = builder.getOrphanage().newOrphan<Text>(8);
  ASSERT_EQ(8u, orphan.get().size());
  memcpy(orphan.get().begin(), "12345678", 8);

  auto root = builder.initRoot<TestAllTypes>();
  root.adoptTextField(kj::mv(orphan));
  EXPECT_EQ("12345678", root.getTextField());
}